

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O0

void __thiscall SlotCreateUpdateForm::clean(SlotCreateUpdateForm *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_> *this_00;
  DateTime *sTime;
  DateTime *eTime;
  Room *pRVar5;
  allocator local_e1;
  int length;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  reference local_38;
  pair<const_int,_Slot> *i;
  iterator __end1;
  iterator __begin1;
  map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_> *__range1;
  bool roomFlag;
  SlotCreateUpdateForm *this_local;
  
  bVar2 = true;
  this_00 = Model<Slot>::all();
  __end1 = std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::begin
                     (this_00);
  i = (pair<const_int,_Slot> *)
      std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::end
                (this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    local_38 = std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator*(&__end1);
    if (bVar2) {
      pRVar5 = Slot::getRoom(&local_38->second);
      iVar3 = Room::getRoomNumber(pRVar5);
      iVar4 = Room::getRoomNumber(&this->room);
      if (iVar3 == iVar4) {
        sTime = Slot::getStartTime(&local_38->second);
        eTime = Slot::getEndTime(&local_38->second);
        bVar1 = clash(this,sTime,eTime);
        if (bVar1) {
          bVar2 = false;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_58,
                     "Some other Professor\'s slot is clashing with yours, please try again!",
                     &local_59);
          Form::addError((Form *)this,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator((allocator<char> *)&local_59);
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator++(&__end1);
  }
  iVar3 = Room::getStrength(&this->room);
  iVar4 = Room::getRoomNumber(&this->room);
  pRVar5 = Model<Room>::findById(iVar4);
  iVar4 = Room::getStrength(pRVar5);
  if (iVar4 < iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"Strength Exceeded",&local_91);
    Form::addError((Form *)this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  bVar2 = Room::hasAudio(&this->room);
  if (bVar2) {
    iVar3 = Room::getRoomNumber(&this->room);
    pRVar5 = Model<Room>::findById(iVar3);
    bVar2 = Room::hasAudio(pRVar5);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"Audio not available",&local_b9);
      Form::addError((Form *)this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  bVar2 = Room::hasVideo(&this->room);
  if (bVar2) {
    iVar3 = Room::getRoomNumber(&this->room);
    pRVar5 = Model<Room>::findById(iVar3);
    bVar2 = Room::hasVideo(pRVar5);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&length,"Video not available",&local_e1);
      Form::addError((Form *)this,(string *)&length);
      std::__cxx11::string::~string((string *)&length);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
  }
  return;
}

Assistant:

void SlotCreateUpdateForm::clean() {
    bool roomFlag = true;
//    for (auto &i : Slot::all()) {
//        if (!(roomFlag &&
//              room.getStrength() <= i.second.getRoom().getStrength() &&
//              ((room.hasAudio() && i.second.getRoom().hasAudio()) || !room.hasAudio()) &&
//              ((room.hasVideo() && i.second.getRoom().hasVideo()) || !room.hasVideo()) &&
//              (i.second.getStartTime() >= endTime || i.second.getEndTime() <= startTime))) {
//            roomFlag = false;
//        }
//    }

    for(auto &i: Slot::all()) {
        if (roomFlag && i.second.getRoom().getRoomNumber() == room.getRoomNumber() &&
            clash(i.second.getStartTime(), i.second.getEndTime())) {
            roomFlag = false;
            addError("Some other Professor's slot is clashing with yours, please try again!");
        }
    }
    //if (!roomFlag) addError("Error: The following may be occuring");    //TODO
    if(room.getStrength()>Room::findById(room.getRoomNumber())->getStrength())
    {
        roomFlag = false;
        addError("Strength Exceeded");
    }
    if(room.hasAudio() && !Room::findById(room.getRoomNumber())->hasAudio())
    {
        roomFlag = false;
        addError("Audio not available");
    }
    if(room.hasVideo() && !Room::findById(room.getRoomNumber())->hasVideo())
    {
        roomFlag = false;
        addError("Video not available");
    }
    int length = sizeof(reason) / sizeof(char);
    if (length > 2048) addError("Reason size is limited to 2048 characters\n");
}